

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyagg_impl.h
# Opt level: O3

int secp256k1_musig_pubkey_agg_callback(secp256k1_scalar *sc,secp256k1_ge *pt,size_t idx,void *data)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  int iVar4;
  int extraout_EAX;
  secp256k1_ge *a;
  secp256k1_context *ctx;
  
  ctx = *data;
  a = pt;
  iVar4 = secp256k1_pubkey_load
                    (ctx,pt,*(secp256k1_pubkey **)(*(long *)((long)data + 0x28) + idx * 8));
  if (iVar4 != 0) {
    secp256k1_musig_keyaggcoef_internal
              (sc,(uchar *)((long)data + 8),pt,(secp256k1_ge *)((long)data + 0x30));
    return 1;
  }
  secp256k1_musig_pubkey_agg_callback_cold_1();
  (ctx->ecmult_gen_ctx).built = -0x2044520c;
  secp256k1_ge_to_bytes(&(ctx->ecmult_gen_ctx).field_0x4,a);
  secp256k1_ge_to_bytes_ext((uchar *)((long)(ctx->ecmult_gen_ctx).ge_offset.x.n + 0x1c),a + 1);
  uVar1 = a[2].x.n[0];
  uVar2 = a[2].x.n[1];
  uVar3 = a[2].x.n[3];
  *(uint64_t *)((long)(ctx->ecmult_gen_ctx).proj_blind.n + 4) = a[2].x.n[2];
  *(uint64_t *)((long)(ctx->ecmult_gen_ctx).proj_blind.n + 0xc) = uVar3;
  *(uint64_t *)&(ctx->ecmult_gen_ctx).ge_offset.y.normalized = uVar1;
  *(uint64_t *)&(ctx->ecmult_gen_ctx).ge_offset.field_0x64 = uVar2;
  *(char *)((long)(ctx->ecmult_gen_ctx).proj_blind.n + 0x14) = (char)a[2].y.n[2];
  secp256k1_scalar_get_b32
            ((uchar *)((long)(ctx->ecmult_gen_ctx).proj_blind.n + 0x15),
             (secp256k1_scalar *)(a[2].x.n + 4));
  return extraout_EAX;
}

Assistant:

static int secp256k1_musig_pubkey_agg_callback(secp256k1_scalar *sc, secp256k1_ge *pt, size_t idx, void *data) {
    secp256k1_musig_pubkey_agg_ecmult_data *ctx = (secp256k1_musig_pubkey_agg_ecmult_data *) data;
    int ret;
    ret = secp256k1_pubkey_load(ctx->ctx, pt, ctx->pks[idx]);
#ifdef VERIFY
    /* pubkey_load can't fail because the same pks have already been loaded in
     * `musig_compute_pks_hash` (and we test this). */
    VERIFY_CHECK(ret);
#else
    (void) ret;
#endif
    secp256k1_musig_keyaggcoef_internal(sc, ctx->pks_hash, pt, &ctx->second_pk);
    return 1;
}